

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O3

NodeId __thiscall
optimization::common_expr_del::BlockNodes::add_node
          (BlockNodes *this,Op op,
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *operands,VarId *var)

{
  NodeId nodeId;
  long in_RCX;
  _Move_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
  in_stack_ffffffffffffffa8;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  VarId local_38;
  
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_50,
           (vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)var);
  nodeId = add_node(this,(Op)in_stack_ffffffffffffffa8.
                             super__Copy_assign_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             .
                             super__Move_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             .
                             super__Copy_ctor_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                             .
                             super__Variant_storage_alias<mir::inst::Op,_optimization::common_expr_del::ExtraNormOp,_optimization::common_expr_del::InNormOp>
                    ,operands);
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_50);
  local_38.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
  local_38.id = *(uint32_t *)(in_RCX + 8);
  add_var(this,&local_38,nodeId);
  return (NodeId)nodeId.id;
}

Assistant:

NodeId add_node(Op op, std::vector<Operand> operands, mir::inst::VarId var) {
    auto nodeId = add_node(op, operands);
    add_var(var, nodeId.id);
    return nodeId;
  }